

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessianUtils.cpp
# Opt level: O2

void completeHessian(HighsInt full_dim,HighsHessian *hessian)

{
  HighsInt nnz;
  int local_48;
  int local_44;
  HighsHessian *local_40;
  double local_38;
  
  if (hessian->dim_ != full_dim) {
    local_44 = HighsHessian::numNz(hessian);
    HighsHessian::exactResize(hessian);
    local_40 = hessian;
    for (local_48 = hessian->dim_; local_48 < full_dim; local_48 = local_48 + 1) {
      std::vector<int,_std::allocator<int>_>::push_back(&hessian->index_,&local_48);
      local_38 = 0.0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(&hessian->value_,&local_38)
      ;
      local_44 = local_44 + 1;
      std::vector<int,_std::allocator<int>_>::push_back(&hessian->start_,&local_44);
    }
    local_40->dim_ = full_dim;
  }
  return;
}

Assistant:

void completeHessian(const HighsInt full_dim, HighsHessian& hessian) {
  // Ensure that any non-zero Hessian of dimension less than the
  // number of columns in the model is completed with explicit zero
  // diagonal entries
  assert(hessian.dim_ <= full_dim);
  if (hessian.dim_ == full_dim) return;
  HighsInt nnz = hessian.numNz();
  hessian.exactResize();
  for (HighsInt iCol = hessian.dim_; iCol < full_dim; iCol++) {
    hessian.index_.push_back(iCol);
    hessian.value_.push_back(0);
    nnz++;
    hessian.start_.push_back(nnz);
  }
  hessian.dim_ = full_dim;
  assert(HighsInt(hessian.start_.size()) == hessian.dim_ + 1);
}